

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.h
# Opt level: O0

void __thiscall
Js::StringBuilder<Memory::ArenaAllocator>::AppendSz
          (StringBuilder<Memory::ArenaAllocator> *this,char16 *str)

{
  char16 *local_18;
  char16 *str_local;
  StringBuilder<Memory::ArenaAllocator> *this_local;
  
  local_18 = str;
  while (*local_18 != L'\0') {
    Append(this,*local_18);
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void AppendSz(const char16 * str)
        {
            // WARNING!!
            // Do not use this to append JavascriptStrings.  They can have embedded
            // nulls which obviously won't be handled correctly here.  Instead use
            // Append with a length, which will use memcpy and correctly include any
            // embedded null characters.
            // WARNING!!

            while (*str != _u('\0'))
            {
                Append(*str++);
            }
        }